

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

UINT16 TPMU_ATTEST_Marshal(TPMU_ATTEST *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT16 UVar1;
  UINT16 UVar2;
  TPM2B_DIGEST *source_00;
  
  switch(selector) {
  case 0x8014:
    UVar1 = TPMS_NV_CERTIFY_INFO_Marshal(&source->nv,buffer,size);
    return UVar1;
  case 0x8015:
    UVar1 = TPMS_COMMAND_AUDIT_INFO_Marshal(&source->commandAudit,buffer,size);
    return UVar1;
  case 0x8016:
    UVar1 = TPMS_SESSION_AUDIT_INFO_Marshal(&source->sessionAudit,buffer,size);
    return UVar1;
  case 0x8017:
    UVar1 = TPM2B_NAME_Marshal((TPM2B_NAME *)source,buffer,size);
    UVar2 = TPM2B_NAME_Marshal(&(source->certify).qualifiedName,buffer,size);
    goto LAB_00107764;
  case 0x8018:
    UVar1 = TPML_PCR_SELECTION_Marshal((TPML_PCR_SELECTION *)&source->certify,buffer,size);
    source_00 = &(source->quote).pcrDigest;
    break;
  case 0x8019:
    TPMS_TIME_ATTEST_INFO_Marshal(&source->time,buffer,size);
    return 0x21;
  case 0x801a:
    UVar1 = TPM2B_NAME_Marshal((TPM2B_NAME *)source,buffer,size);
    source_00 = &(source->creation).creationHash;
    break;
  default:
    return 0;
  }
  UVar2 = TPM2B_DIGEST_Marshal(source_00,buffer,size);
LAB_00107764:
  return UVar2 + UVar1;
}

Assistant:

UINT16
TPMU_ATTEST_Marshal(TPMU_ATTEST *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
        case TPM_ST_ATTEST_CERTIFY:
            return TPMS_CERTIFY_INFO_Marshal((TPMS_CERTIFY_INFO *)&(source->certify), buffer, size);
        case TPM_ST_ATTEST_CREATION:
            return TPMS_CREATION_INFO_Marshal((TPMS_CREATION_INFO *)&(source->creation), buffer, size);
        case TPM_ST_ATTEST_QUOTE:
            return TPMS_QUOTE_INFO_Marshal((TPMS_QUOTE_INFO *)&(source->quote), buffer, size);
        case TPM_ST_ATTEST_COMMAND_AUDIT:
            return TPMS_COMMAND_AUDIT_INFO_Marshal((TPMS_COMMAND_AUDIT_INFO *)&(source->commandAudit), buffer, size);
        case TPM_ST_ATTEST_SESSION_AUDIT:
            return TPMS_SESSION_AUDIT_INFO_Marshal((TPMS_SESSION_AUDIT_INFO *)&(source->sessionAudit), buffer, size);
        case TPM_ST_ATTEST_TIME:
            return TPMS_TIME_ATTEST_INFO_Marshal((TPMS_TIME_ATTEST_INFO *)&(source->time), buffer, size);
        case TPM_ST_ATTEST_NV:
            return TPMS_NV_CERTIFY_INFO_Marshal((TPMS_NV_CERTIFY_INFO *)&(source->nv), buffer, size);
    }
    return 0;
}